

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O1

void __thiscall glu::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  Shader *this_00;
  void *pvVar1;
  pointer ppSVar2;
  long lVar3;
  int shaderType;
  long lVar4;
  
  lVar4 = 0;
  do {
    ppSVar2 = this->m_shaders[lVar4].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)this->m_shaders[lVar4].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2) >> 3)) {
      lVar3 = 0;
      do {
        this_00 = ppSVar2[lVar3];
        if (this_00 != (Shader *)0x0) {
          Shader::~Shader(this_00);
          operator_delete(this_00,0x68);
        }
        lVar3 = lVar3 + 1;
        ppSVar2 = this->m_shaders[lVar4].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (lVar3 < (int)((ulong)((long)this->m_shaders[lVar4].
                                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppSVar2) >> 3));
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  Program::~Program(&this->m_program);
  lVar4 = 0x90;
  do {
    pvVar1 = *(void **)((long)(this->m_shaders + -1) + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)this->m_shaders + lVar4 + -8) - (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0);
  return;
}

Assistant:

ShaderProgram::~ShaderProgram (void)
{
	for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
		for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
			delete m_shaders[shaderType][shaderNdx];
}